

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

void __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::visitConnectionEndpoint
          (QualifiedIdentifierResolver *this,SharedEndpoint *endpoint)

{
  bool bVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  ProcessorBase *processor;
  ProcessorInstanceRef *o;
  bool local_7a;
  pool_ptr<soul::AST::Expression> local_68;
  pool_ptr<soul::AST::ProcessorBase> local_60;
  SharedEndpoint local_58;
  byte local_49;
  pool_ref<soul::AST::Expression> local_48;
  pool_ref<soul::AST::Expression> local_40 [3];
  pool_ptr<soul::AST::Connection::SharedEndpoint> local_28;
  pool_ptr<soul::AST::Connection::SharedEndpoint> local_20;
  pool_ptr<soul::AST::Connection::SharedEndpoint> oldEndpoint;
  SharedEndpoint *endpoint_local;
  QualifiedIdentifierResolver *this_local;
  
  local_20.object = (this->currentConnectionEndpoint).object;
  oldEndpoint.object = endpoint;
  pool_ptr<soul::AST::Connection::SharedEndpoint>::
  pool_ptr<soul::AST::Connection::SharedEndpoint,void>(&local_28,endpoint);
  (this->currentConnectionEndpoint).object = local_28.object;
  pool_ptr<soul::AST::Connection::SharedEndpoint>::~pool_ptr(&local_28);
  RewritingASTVisitor::replaceExpression
            ((RewritingASTVisitor *)this,&(oldEndpoint.object)->endpoint);
  local_40[0].object = ((oldEndpoint.object)->endpoint).object;
  local_49 = 0;
  bVar1 = is_type<soul::AST::ProcessorRef,soul::AST::Expression>(local_40);
  local_7a = true;
  if (!bVar1) {
    local_48.object = ((oldEndpoint.object)->endpoint).object;
    local_49 = 1;
    local_7a = is_type<soul::AST::ProcessorBase,soul::AST::Expression>(&local_48);
  }
  if ((local_49 & 1) != 0) {
    pool_ref<soul::AST::Expression>::~pool_ref(&local_48);
  }
  pool_ref<soul::AST::Expression>::~pool_ref(local_40);
  if (local_7a != false) {
    (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
    super_RewritingASTVisitor.itemsReplaced =
         (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
         super_RewritingASTVisitor.itemsReplaced + 1;
    pEVar2 = pool_ref<soul::AST::Expression>::operator->(&(oldEndpoint.object)->endpoint);
    pEVar3 = pool_ref<soul::AST::Expression>::operator->(&(oldEndpoint.object)->endpoint);
    (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[6])(&local_60);
    processor = pool_ptr<soul::AST::ProcessorBase>::operator*(&local_60);
    pool_ptr<soul::AST::Expression>::pool_ptr(&local_68);
    o = getOrCreateImplicitProcessorInstance
                  (this,&(pEVar2->super_Statement).super_ASTObject.context,processor,&local_68);
    pool_ref<soul::AST::Expression>::pool_ref<soul::AST::ProcessorInstanceRef,void>
              (&local_58.endpoint,o);
    ((oldEndpoint.object)->endpoint).object = (Expression *)local_58;
    pool_ref<soul::AST::Expression>::~pool_ref(&local_58.endpoint);
    pool_ptr<soul::AST::Expression>::~pool_ptr(&local_68);
    pool_ptr<soul::AST::ProcessorBase>::~pool_ptr(&local_60);
  }
  (this->currentConnectionEndpoint).object = local_20.object;
  pool_ptr<soul::AST::Connection::SharedEndpoint>::~pool_ptr(&local_20);
  return;
}

Assistant:

void visitConnectionEndpoint (AST::Connection::SharedEndpoint& endpoint)
        {
            auto oldEndpoint = currentConnectionEndpoint;
            currentConnectionEndpoint = endpoint;
            replaceExpression (endpoint.endpoint);

            if (is_type<AST::ProcessorRef> (endpoint.endpoint) || is_type<AST::ProcessorBase> (endpoint.endpoint))
            {
                ++itemsReplaced;
                endpoint.endpoint = getOrCreateImplicitProcessorInstance (endpoint.endpoint->context,
                                                                          *endpoint.endpoint->getAsProcessor(), {});
            }

            currentConnectionEndpoint = oldEndpoint;
        }